

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

bool __thiscall
Jinx::Impl::Parser::CheckFunctionCallPart
          (Parser *this,FunctionSignaturePartsI *parts,size_t partsIndex,SymbolListCItr currSym,
          SymbolListCItr endSym,FunctionMatch *match)

{
  _Head_base<1UL,_unsigned_long,_false> *p_Var1;
  SymbolType symbol;
  pointer pFVar2;
  vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
  *__x;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  undefined8 extraout_RAX;
  uint uVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *this_00;
  long lVar8;
  long lVar9;
  bool bVar10;
  FunctionPartData *pFVar11;
  FunctionMatch newMatch;
  pointer local_e0;
  FunctionMatch *local_d8;
  Parser *local_d0;
  undefined1 local_c8 [8];
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  _Stack_c0;
  SymbolListCItr local_a8;
  uint local_9c;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *local_98;
  FunctionSignaturePartsI *local_90;
  vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
  *local_88;
  size_t local_80;
  SymbolListCItr local_78;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *local_70;
  FunctionMatch local_68;
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  local_48;
  
  pFVar2 = (parts->
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(parts->
                 super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 6) *
          -0x5555555555555555;
  if (currSym._M_current == endSym._M_current || (uVar5 < partsIndex || uVar5 - partsIndex == 0)) {
    return false;
  }
  if (((this->m_error != false) ||
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish == currSym._M_current)) ||
     ((currSym._M_current)->type == NewLine)) {
    if (pFVar2[partsIndex].optional != true) {
      return false;
    }
    return uVar5 - 1 == partsIndex;
  }
  local_d8 = match;
  local_d0 = this;
  local_a8._M_current = endSym._M_current;
  if (pFVar2[partsIndex].partType == Name) {
    if (((pFVar2[partsIndex].optional == false) && ((currSym._M_current)->type != NameValue)) &&
       (bVar3 = IsKeyword((currSym._M_current)->type), !bVar3)) {
      return false;
    }
    this_00 = pFVar2[partsIndex].names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_98 = pFVar2[partsIndex].names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 == local_98) {
      uVar6 = 0;
      bVar3 = true;
    }
    else {
      local_70 = &(currSym._M_current)->text;
      local_88 = (vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
                  *)&local_d8->partData;
      local_78._M_current = currSym._M_current + 1;
      local_80 = partsIndex + 1;
      local_9c = 0;
      local_90 = parts;
      do {
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                compare(this_00,local_70);
        __x = local_88;
        iVar7 = 0;
        if (iVar4 == 0) {
          local_c8[0] = pFVar2[partsIndex].optional;
          _Stack_c0._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
          _Stack_c0._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((ulong)_Stack_c0._M_impl.super__Vector_impl_data._M_finish &
                        0xffffffff00000000);
          std::
          vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
          ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
                    (local_88,(tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> *)
                              local_c8);
          local_c8 = (undefined1  [8])local_d8->signature;
          std::
          vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::vector((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    *)&_Stack_c0,
                   (vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    *)__x);
          bVar3 = CheckFunctionCallPart
                            (local_d0,local_90,local_80,local_78,local_a8,(FunctionMatch *)local_c8)
          ;
          iVar7 = 2;
          if (bVar3) {
            local_d8->signature = (FunctionSignature *)local_c8;
            iVar7 = 1;
            std::
            vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::operator=((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         *)local_88,
                        (vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         *)&_Stack_c0);
          }
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base(&_Stack_c0);
          local_9c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
        if (iVar7 != 0) goto LAB_0012000c;
        this_00 = this_00 + 1;
      } while (this_00 != local_98);
      iVar7 = 2;
LAB_0012000c:
      bVar3 = iVar7 == 2;
      parts = local_90;
      uVar6 = local_9c;
    }
    if (!bVar3) {
      return true;
    }
    if (((uVar6 & 1) == 0) && (pFVar2[partsIndex].optional == true)) {
      local_c8 = (undefined1  [8])local_d8->signature;
      pFVar11 = &local_d8->partData;
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::vector((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                *)&_Stack_c0,pFVar11);
      local_68.signature._0_1_ = 1;
      local_68.partData.
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.partData.
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_68.partData.
                            super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
      ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
                ((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
                  *)&_Stack_c0,
                 (tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> *)&local_68);
      bVar3 = CheckFunctionCallPart
                        (local_d0,parts,partsIndex + 1,currSym,local_a8,(FunctionMatch *)local_c8);
      if (bVar3) {
        local_d8->signature = (FunctionSignature *)local_c8;
        std::
        vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::operator=(pFVar11,(vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                             *)&_Stack_c0);
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base(&_Stack_c0);
        if (bVar3) {
          return true;
        }
      }
      else {
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base(&_Stack_c0);
      }
    }
    goto LAB_00120261;
  }
  local_98 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
             (((long)(match->partData).
                     super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(match->partData).
                     super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_e0 = (pointer)0x0;
  bVar3 = CheckVariable(this,currSym,(size_t *)&local_e0);
  if (((bVar3) || (bVar3 = CheckProperty(this,currSym,(size_t *)&local_e0), bVar3)) ||
     (bVar3 = CheckFunctionDeclaration(this,currSym,(size_t *)&local_e0), bVar3)) {
    if (local_e0 != (pointer)0x0) {
      currSym._M_current = currSym._M_current + (long)local_e0;
    }
    goto LAB_0011fe9e;
  }
  symbol = (currSym._M_current)->type;
  if (symbol == ParenClose) {
LAB_0012021d:
    bVar3 = false;
    bVar10 = false;
  }
  else {
    if (symbol == ParenOpen) {
      currSym._M_current = currSym._M_current + 1;
      if (local_d0->m_error == false) {
        local_e0 = (pointer)0x2;
        bVar3 = false;
        lVar8 = 1;
        while( true ) {
          if ((currSym._M_current ==
               (local_d0->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish) || ((currSym._M_current)->type == NewLine))
          goto LAB_00120211;
          lVar9 = -(ulong)((currSym._M_current)->type == ParenClose);
          if ((currSym._M_current)->type == ParenOpen) {
            lVar9 = 1;
          }
          lVar8 = lVar8 + lVar9;
          bVar3 = lVar8 == 0;
          if (bVar3) break;
          currSym._M_current = currSym._M_current + 1;
          local_e0 = (pointer)&(local_e0->
                               super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>
                               ).super__Tuple_impl<1UL,_unsigned_long,_bool>.field_0x1;
        }
        currSym._M_current = currSym._M_current + 1;
      }
      else {
        local_e0 = (pointer)0x2;
        bVar3 = false;
      }
LAB_00120211:
      if (!bVar3) goto LAB_0012021d;
    }
    else {
      bVar3 = IsConstant(symbol);
      if (((bVar3) || ((currSym._M_current)->type == Not)) ||
         ((partsIndex < local_98 &&
          (((bVar3 = IsOperator((currSym._M_current)->type), bVar3 ||
            ((currSym._M_current)->type == Or)) || ((currSym._M_current)->type == And)))))) {
        currSym._M_current = currSym._M_current + 1;
        local_e0 = (pointer)0x1;
      }
      else {
        if (partsIndex == 0) goto LAB_0012021d;
        CheckFunctionCall((FunctionMatch *)local_c8,local_d0,false,currSym,local_a8);
        if (local_c8 == (undefined1  [8])0x0) {
          CheckFunctionCall(&local_68,local_d0,true,currSym,local_a8);
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
               _Stack_c0._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_48._M_impl.super__Vector_impl_data._M_finish =
               _Stack_c0._M_impl.super__Vector_impl_data._M_finish;
          local_48._M_impl.super__Vector_impl_data._M_start =
               _Stack_c0._M_impl.super__Vector_impl_data._M_start;
          local_c8 = (undefined1  [8])CONCAT71(local_68.signature._1_7_,local_68.signature._0_1_);
          _Stack_c0._M_impl.super__Vector_impl_data._M_start =
               local_68.partData.
               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          _Stack_c0._M_impl.super__Vector_impl_data._M_finish =
               local_68.partData.
               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          _Stack_c0._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_68.partData.
               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_68.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base(&local_48);
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base(&local_68.partData.
                           super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         );
          if (local_c8 == (undefined1  [8])0x0) {
            std::
            _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::~_Vector_base(&_Stack_c0);
            goto LAB_0012021d;
          }
          lVar8 = (long)_Stack_c0._M_impl.super__Vector_impl_data._M_finish -
                  (long)_Stack_c0._M_impl.super__Vector_impl_data._M_start >> 3;
          uVar5 = lVar8 * -0x5555555555555555;
          if (1 < uVar5) {
            currSym._M_current = currSym._M_current + lVar8 * 0x5555555555555568 + -0x38;
            local_e0 = (pointer)((long)local_e0 + (uVar5 - 1));
          }
        }
        else if ((long)_Stack_c0._M_impl.super__Vector_impl_data._M_finish -
                 (long)_Stack_c0._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar8 = ((long)_Stack_c0._M_impl.super__Vector_impl_data._M_finish -
                   (long)_Stack_c0._M_impl.super__Vector_impl_data._M_start >> 3) *
                  -0x5555555555555555;
          lVar8 = lVar8 + (ulong)(lVar8 == 0);
          currSym._M_current = currSym._M_current + lVar8;
          local_e0 = (pointer)((long)local_e0 + lVar8);
        }
        match = local_d8;
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base(&_Stack_c0);
      }
    }
LAB_0011fe9e:
    pFVar11 = &match->partData;
    if (partsIndex < local_98) {
      p_Var1 = (_Head_base<1UL,_unsigned_long,_false> *)
               ((long)&(pFVar11->
                       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[partsIndex].
                       super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>
                       .super__Tuple_impl<1UL,_unsigned_long,_bool> + 8);
      p_Var1->_M_head_impl =
           (unsigned_long)
           (&(local_e0->
             super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>).
             super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool> +
           p_Var1->_M_head_impl);
    }
    else {
      local_c8 = (undefined1  [8])((ulong)local_c8 & 0xffffffffffffff00);
      _Stack_c0._M_impl.super__Vector_impl_data._M_start = local_e0;
      _Stack_c0._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(_Stack_c0._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
      ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
                ((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
                  *)pFVar11,
                 (tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> *)local_c8);
    }
    local_c8 = (undefined1  [8])local_d8->signature;
    std::
    vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ::vector((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              *)&_Stack_c0,pFVar11);
    bVar3 = CheckFunctionCallPart
                      (local_d0,parts,partsIndex + 1,currSym,local_a8,(FunctionMatch *)local_c8);
    if ((bVar3) ||
       (bVar3 = CheckFunctionCallPart
                          (local_d0,parts,partsIndex,currSym,local_a8,(FunctionMatch *)local_c8),
       bVar3)) {
      local_d8->signature = (FunctionSignature *)local_c8;
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::operator=(pFVar11,(vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                           *)&_Stack_c0);
      bVar10 = true;
      bVar3 = false;
    }
    else {
      bVar3 = true;
      bVar10 = false;
    }
    std::
    _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ::~_Vector_base(&_Stack_c0);
  }
  if (!bVar3) {
    return bVar10;
  }
LAB_00120261:
  return ((long)(local_d8->partData).
                super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_d8->partData).
                super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
         ((long)(parts->
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(parts->
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                )._M_impl.super__Vector_impl_data._M_start >> 6) * 0x5555555555555555 == 0;
}

Assistant:

inline_t bool Parser::CheckFunctionCallPart(const FunctionSignaturePartsI & parts, size_t partsIndex, SymbolListCItr currSym, SymbolListCItr endSym, FunctionMatch & match) const
	{
		// If we reach the end of the parts list, return failure
		if (partsIndex >= parts.size())
			return false;

		// If we've exceeded our range, return failure
		if (currSym == endSym)
			return false;

		const auto & part = parts[partsIndex];

		// Check for invalid symbol
		if (!IsSymbolValid(currSym))
			return part.optional && partsIndex == (parts.size() - 1);

		// Recursively iterate through all parts and match them against the signature.
		if (part.partType == FunctionSignaturePartType::Name)
		{
			if (!part.optional && currSym->type != SymbolType::NameValue && !IsKeyword(currSym->type))
				return false;

			// Attempt to find a matching part name
			bool matchedName = false;
			for (const auto & name : part.names)
			{
				if (name == currSym->text)
				{
					matchedName = true;
					match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Name, 1, part.optional));
					auto newCurrSym = currSym;
					++newCurrSym;
					auto newMatch = match;
					if (CheckFunctionCallPart(parts, partsIndex + 1, newCurrSym, endSym, newMatch))
					{
						match = newMatch;
						return true;
					}
					break;
				}
			}

			// Check if this is an optional part and we haven't yet found a name match
			if (!matchedName && part.optional)
			{
				auto newMatch = match;
				newMatch.partData.push_back(std::make_tuple(FunctionSignaturePartType::Name, 0, true));
				if (CheckFunctionCallPart(parts, partsIndex + 1, currSym, endSym, newMatch))
				{
					match = newMatch;
					return true;
				}
			}
		}
		else
		{
			// Set a flag if this is the initial token in the expression.
			bool isInitialToken = partsIndex >= match.partData.size();

			// Check for valid expressions
			size_t symCount = 0;
			if (CheckVariable(currSym, &symCount) || CheckProperty(currSym, &symCount) || CheckFunctionDeclaration(currSym, &symCount))
			{
				for (size_t i = 0; i < symCount; ++i)
					++currSym;
			}
			else if (currSym->type == SymbolType::ParenOpen)
			{
				size_t parenCount = 1;
				symCount = 1;
				while (parenCount)
				{
					++currSym;
					++symCount;
					if (!IsSymbolValid(currSym))
						return false;
					if (currSym->type == SymbolType::ParenOpen)
						++parenCount;
					else if (currSym->type == SymbolType::ParenClose)
						--parenCount;
				}
				++currSym;
			}
			else if (currSym->type == SymbolType::ParenClose)
			{
				return false;
			}
			else if (IsConstant(currSym->type) || currSym->type == SymbolType::Not)
			{
				++currSym;
				symCount = 1;
			}
			else if (!isInitialToken && (IsOperator(currSym->type) || currSym->type == SymbolType::And || currSym->type == SymbolType::Or))
			{
				++currSym;
				symCount = 1;
			}
			else
			{
				if (partsIndex != 0)
				{
					FunctionMatch exprMatch = CheckFunctionCall(false, currSym, endSym);
					if (exprMatch.signature)
					{
						for (size_t i = 0; i < exprMatch.partData.size(); ++i)
						{
							++currSym;
							++symCount;
						}
					}
					else
					{
						exprMatch = CheckFunctionCall(true, currSym, endSym);
						if (exprMatch.signature)
						{
							for (size_t i = 1; i < exprMatch.partData.size(); ++i)
							{
								++currSym;
								++symCount;
							}
						}
						else
						{
							return false;
						}
					}
				}
				else
				{
					return false;
				}
			}

			// If our match structure isn't up to date, push new match items.  Otherwise,
			// advance our expression token count.  This will be important for determining
			// how many symbols we need to parse for an expression.
			if (isInitialToken)
				match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Parameter, symCount, false));
			else
				std::get<1>(match.partData[partsIndex]) = std::get<1>(match.partData[partsIndex]) + symCount;

			// Store off current match structure
			auto newMatch = match;

			// Check to see if advancing part index leads to success
			if (CheckFunctionCallPart(parts, partsIndex + 1, currSym, endSym, newMatch))
			{
				match = newMatch;
				return true;
			}

			// Check symbols against the current part.
			if (CheckFunctionCallPart(parts, partsIndex, currSym, endSym, newMatch))
			{
				match = newMatch;
				return true;
			}
		}

		return match.partData.size() == parts.size();
	}